

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_GetEndpoints
               (UA_Server *server,UA_Session *session,UA_GetEndpointsRequest *request,
               UA_GetEndpointsResponse *response)

{
  size_t __n;
  UA_Byte *__s1;
  UA_Byte *__s2;
  UA_EndpointDescription *pUVar1;
  long lVar2;
  undefined1 *__s;
  UA_GetEndpointsResponse *pUVar3;
  UA_GetEndpointsRequest *src;
  int iVar4;
  UA_StatusCode UVar5;
  size_t sVar6;
  UA_EndpointDescription *pUVar7;
  size_t __n_00;
  long lVar8;
  size_t sVar9;
  UA_EndpointDescription **ppUVar10;
  size_t sVar11;
  ulong uVar12;
  UA_Byte **ppUVar13;
  size_t sVar14;
  long lVar15;
  undefined8 uStack_90;
  undefined1 auStack_88 [8];
  size_t local_80;
  undefined1 *local_78;
  UA_Byte **local_70;
  UA_EndpointDescription *local_68;
  UA_GetEndpointsResponse *local_60;
  size_t local_58;
  size_t local_50;
  UA_GetEndpointsRequest *local_48;
  UA_EndpointDescription **local_40;
  UA_Server *local_38;
  
  local_80 = (request->endpointUrl).length;
  __n_00 = server->endpointDescriptionsSize;
  lVar2 = -(__n_00 + 0xf & 0xfffffffffffffff0);
  local_78 = auStack_88 + lVar2;
  local_38 = server;
  *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11d796;
  memset(auStack_88 + lVar2,0,__n_00);
  __s = local_78;
  local_40 = (UA_EndpointDescription **)request->profileUrisSize;
  local_48 = request;
  if (local_40 == (UA_EndpointDescription **)0x0) {
    if (__n_00 != 0) {
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11d873;
      memset(__s,1,__n_00);
      sVar14 = __n_00;
LAB_0011d876:
      sVar11 = 1;
      if (local_80 == 0) {
        sVar11 = (local_38->config).networkLayersSize;
      }
      sVar14 = sVar14 * sVar11;
      if (sVar14 == 0) {
        response->endpoints = (UA_EndpointDescription *)0x1;
      }
      else {
        *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11d8a4;
        pUVar7 = (UA_EndpointDescription *)calloc(sVar14,0xd8);
        response->endpoints = pUVar7;
        if (pUVar7 == (UA_EndpointDescription *)0x0) {
          (response->responseHeader).serviceResult = 0x80030000;
          return;
        }
      }
      local_40 = &response->endpoints;
      ppUVar10 = local_40;
      response->endpointsSize = sVar14;
      if (sVar11 == 0) {
        return;
      }
      local_48 = (UA_GetEndpointsRequest *)&local_48->endpointUrl;
      sVar9 = 0;
      UVar5 = 0;
      lVar8 = 0;
      sVar14 = __n_00;
      local_68 = (UA_EndpointDescription *)sVar11;
      local_60 = response;
      do {
        if (local_80 == 0) {
          local_48 = (UA_GetEndpointsRequest *)&(local_38->config).networkLayers[sVar9].discoveryUrl
          ;
        }
        local_70 = (UA_Byte **)sVar9;
        if (__n_00 == 0) {
          __n_00 = 0;
        }
        else {
          lVar15 = 0;
          uVar12 = 0;
          __n_00 = sVar14;
          do {
            if (local_78[uVar12] == '\x01') {
              local_58 = CONCAT44(local_58._4_4_,UVar5);
              pUVar7 = local_38->endpointDescriptions;
              pUVar1 = *ppUVar10;
              *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11d974;
              UVar5 = UA_copy((void *)((long)&(pUVar7->endpointUrl).length + lVar15),pUVar1 + lVar8,
                              UA_TYPES + 0x9b);
              src = local_48;
              local_50 = CONCAT44(local_50._4_4_,UVar5);
              pUVar7 = *ppUVar10;
              *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11d98e;
              UVar5 = UA_copy(src,pUVar7 + lVar8,UA_TYPES + 0xb);
              UVar5 = (uint)local_58 | UVar5 | (uint)local_50;
              lVar8 = lVar8 + 1;
              __n_00 = local_38->endpointDescriptionsSize;
            }
            uVar12 = uVar12 + 1;
            lVar15 = lVar15 + 0xd8;
            sVar14 = __n_00;
          } while (uVar12 < __n_00);
        }
        pUVar3 = local_60;
        sVar9 = (long)local_70 + 1;
      } while ((UA_EndpointDescription *)sVar9 != local_68);
      if (UVar5 == 0) {
        return;
      }
      (local_60->responseHeader).serviceResult = UVar5;
      sVar11 = local_60->endpointsSize;
      pUVar7 = local_60->endpoints;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11d9f0;
      UA_Array_delete(pUVar7,sVar11,UA_TYPES + 0x9b);
      pUVar3->endpointsSize = 0;
      pUVar3->endpoints = (UA_EndpointDescription *)0x0;
      return;
    }
  }
  else if (__n_00 != 0) {
    local_68 = local_38->endpointDescriptions;
    local_70 = &request->profileUris->data;
    sVar6 = 0;
    sVar14 = 0;
    local_60 = response;
    do {
      pUVar7 = local_68;
      __n = local_68[sVar6].transportProfileUri.length;
      ppUVar10 = local_40;
      ppUVar13 = local_70;
      local_58 = sVar14;
      local_50 = sVar6;
      do {
        if (((UA_String *)(ppUVar13 + -1))->length == __n) {
          __s1 = *ppUVar13;
          __s2 = pUVar7[sVar6].transportProfileUri.data;
          *(undefined8 *)((long)&uStack_90 + lVar2) = 0x11d81d;
          iVar4 = bcmp(__s1,__s2,__n);
          if (iVar4 == 0) {
            local_78[local_50] = 1;
            sVar14 = local_58 + 1;
            break;
          }
        }
        ppUVar13 = ppUVar13 + 2;
        ppUVar10 = (UA_EndpointDescription **)((long)ppUVar10 - 1);
        sVar14 = local_58;
      } while (ppUVar10 != (UA_EndpointDescription **)0x0);
      sVar6 = local_50 + 1;
    } while (sVar6 != __n_00);
    response = local_60;
    if (sVar14 != 0) goto LAB_0011d876;
  }
  response->endpointsSize = 0;
  return;
}

Assistant:

void Service_GetEndpoints(UA_Server *server, UA_Session *session, const UA_GetEndpointsRequest *request,
                          UA_GetEndpointsResponse *response) {
    /* If the client expects to see a specific endpointurl, mirror it back. If
       not, clone the endpoints with the discovery url of all networklayers. */
    const UA_String *endpointUrl = &request->endpointUrl;
    if(endpointUrl->length > 0) {
        UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing GetEndpointsRequest with endpointUrl " \
                             UA_PRINTF_STRING_FORMAT, UA_PRINTF_STRING_DATA(*endpointUrl));
    } else {
        UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing GetEndpointsRequest with an empty endpointUrl");
    }

    /* test if the supported binary profile shall be returned */
#ifdef NO_ALLOCA
    UA_Boolean relevant_endpoints[server->endpointDescriptionsSize];
#else
    UA_Boolean *relevant_endpoints = UA_alloca(sizeof(UA_Boolean) * server->endpointDescriptionsSize);
#endif
    memset(relevant_endpoints, 0, sizeof(UA_Boolean) * server->endpointDescriptionsSize);
    size_t relevant_count = 0;
    if(request->profileUrisSize == 0) {
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j)
            relevant_endpoints[j] = true;
        relevant_count = server->endpointDescriptionsSize;
    } else {
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j) {
            for(size_t i = 0; i < request->profileUrisSize; ++i) {
                if(!UA_String_equal(&request->profileUris[i], &server->endpointDescriptions[j].transportProfileUri))
                    continue;
                relevant_endpoints[j] = true;
                ++relevant_count;
                break;
            }
        }
    }

    if(relevant_count == 0) {
        response->endpointsSize = 0;
        return;
    }

    /* Clone the endpoint for each networklayer? */
    size_t clone_times = 1;
    UA_Boolean nl_endpointurl = false;
    if(endpointUrl->length == 0) {
        clone_times = server->config.networkLayersSize;
        nl_endpointurl = true;
    }

    response->endpoints = UA_Array_new(relevant_count * clone_times, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
    if(!response->endpoints) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->endpointsSize = relevant_count * clone_times;

    size_t k = 0;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    for(size_t i = 0; i < clone_times; ++i) {
        if(nl_endpointurl)
            endpointUrl = &server->config.networkLayers[i].discoveryUrl;
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j) {
            if(!relevant_endpoints[j])
                continue;
            retval |= UA_EndpointDescription_copy(&server->endpointDescriptions[j], &response->endpoints[k]);
            retval |= UA_String_copy(endpointUrl, &response->endpoints[k].endpointUrl);
            ++k;
        }
    }

    if(retval != UA_STATUSCODE_GOOD) {
        response->responseHeader.serviceResult = retval;
        UA_Array_delete(response->endpoints, response->endpointsSize, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
        response->endpoints = NULL;
        response->endpointsSize = 0;
        return;
    }
}